

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_4dPoint * __thiscall ON_4dPoint::operator=(ON_4dPoint *this,float *p)

{
  if (p != (float *)0x0) {
    this->x = (double)*p;
    this->y = (double)p[1];
    this->z = (double)p[2];
    this->w = (double)p[3];
    return this;
  }
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  this->w = 1.0;
  return this;
}

Assistant:

ON_4dPoint& ON_4dPoint::operator=(const float* p)
{
  if ( p ) {
    x = (double)p[0];
    y = (double)p[1];
    z = (double)p[2];
    w = (double)p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}